

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  stbi_uc sVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  int sizes [16];
  int iVar7;
  
  if (m == 0xc4) {
    iVar9 = stbi__get16be(z->s);
    for (iVar9 = iVar9 + -2; 0 < iVar9; iVar9 = (iVar9 + -0x11) - (int)uVar11) {
      bVar5 = stbi__get8(z->s);
      if ((0x1f < bVar5) || (bVar1 = bVar5 & 0xf, 3 < bVar1)) {
        stbi__g_failure_reason = "bad DHT header";
        goto LAB_001b2d91;
      }
      uVar11 = 0;
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        bVar2 = stbi__get8(z->s);
        sizes[lVar12] = (uint)bVar2;
        uVar11 = (ulong)((int)uVar11 + (uint)bVar2);
      }
      if (bVar5 < 0x10) {
        iVar7 = stbi__build_huffman(z->huff_dc + bVar1,sizes);
        lVar12 = 8;
      }
      else {
        iVar7 = stbi__build_huffman(z->huff_ac + bVar1,sizes);
        lVar12 = 0x1a48;
      }
      if (iVar7 == 0) goto LAB_001b2d91;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        sVar4 = stbi__get8(z->s);
        z->huff_dc[bVar1].values[uVar13 + lVar12 + -8] = sVar4;
      }
      if (0xf < bVar5) {
        for (lVar12 = 0; lVar12 != 0x200; lVar12 = lVar12 + 1) {
          uVar13 = (ulong)z->huff_ac[bVar1].fast[lVar12];
          z->fast_ac[bVar1][lVar12] = 0;
          if (uVar13 != 0xff) {
            bVar5 = z->huff_ac[bVar1].values[uVar13];
            if ((bVar5 & 0xf) != 0) {
              bVar2 = z->huff_ac[bVar1].size[uVar13];
              uVar6 = (bVar5 & 0xf) + (ushort)bVar2;
              if (uVar6 < 10) {
                uVar10 = (int)lVar12 << (bVar2 & 0x1f) & 0x1ff;
                sVar3 = (sbyte)(bVar5 & 0xf);
                uVar8 = -1 << sVar3 | 1;
                if (0xff < uVar10) {
                  uVar8 = 0;
                }
                iVar7 = uVar8 + (uVar10 >> (9U - sVar3 & 0x1f));
                if ((char)iVar7 == iVar7) {
                  z->fast_ac[bVar1][lVar12] = (short)iVar7 * 0x100 | bVar5 & 0xfff0 | uVar6;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (m != 0xdb) {
      if (m == 0xdd) {
        iVar9 = stbi__get16be(z->s);
        if (iVar9 == 4) {
          iVar9 = stbi__get16be(z->s);
          z->restart_interval = iVar9;
LAB_001b2e3f:
          bVar14 = true;
          goto LAB_001b2d93;
        }
        stbi__g_failure_reason = "bad DRI len";
      }
      else if (m == 0xff) {
        stbi__g_failure_reason = "expected marker";
      }
      else if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        uVar8 = stbi__get16be(z->s);
        if (1 < uVar8) {
          if (uVar8 < 7 || m != 0xe0) {
            if (uVar8 < 0xe || m != 0xee) {
              iVar9 = uVar8 - 2;
            }
            else {
              bVar14 = true;
              for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
                sVar4 = stbi__get8(z->s);
                if (sVar4 != "Adobe"[lVar12]) {
                  bVar14 = false;
                }
              }
              if (bVar14) {
                stbi__get8(z->s);
                stbi__get16be(z->s);
                stbi__get16be(z->s);
                bVar5 = stbi__get8(z->s);
                z->app14_color_transform = (uint)bVar5;
                iVar9 = uVar8 - 0xe;
              }
              else {
                iVar9 = uVar8 - 8;
              }
            }
          }
          else {
            bVar14 = true;
            for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
              sVar4 = stbi__get8(z->s);
              if (sVar4 != "JFIF"[lVar12]) {
                bVar14 = false;
              }
            }
            iVar9 = uVar8 - 7;
            if (bVar14) {
              z->jfif = 1;
            }
          }
          stbi__skip(z->s,iVar9);
          goto LAB_001b2e3f;
        }
        if (m == 0xfe) {
          stbi__g_failure_reason = "bad COM len";
        }
        else {
          stbi__g_failure_reason = "bad APP len";
        }
      }
      else {
        stbi__g_failure_reason = "unknown marker";
      }
LAB_001b2d91:
      bVar14 = false;
      goto LAB_001b2d93;
    }
    iVar9 = stbi__get16be(z->s);
    for (iVar9 = iVar9 + -2; 0 < iVar9; iVar9 = iVar9 + (uint)(bVar5 < 0x10) * 0x40 + -0x81) {
      bVar5 = stbi__get8(z->s);
      if ((bVar5 & 0xfffffff0) != 0x10 && 0xf < bVar5) {
        stbi__g_failure_reason = "bad DQT type";
        goto LAB_001b2d91;
      }
      uVar8 = bVar5 & 0xf;
      if (3 < uVar8) {
        stbi__g_failure_reason = "bad DQT table";
        goto LAB_001b2d91;
      }
      for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 1) {
        if (bVar5 < 0x10) {
          bVar1 = stbi__get8(z->s);
          uVar6 = (ushort)bVar1;
        }
        else {
          iVar7 = stbi__get16be(z->s);
          uVar6 = (ushort)iVar7;
        }
        *(ushort *)((long)z->dequant[0] + (ulong)""[lVar12] * 2 + (ulong)(uVar8 << 7)) = uVar6;
      }
    }
  }
  bVar14 = iVar9 == 0;
LAB_001b2d93:
  return (int)bVar14;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}